

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O0

QGraphicsItem * __thiscall QGraphicsLayoutItemPrivate::parentItem(QGraphicsLayoutItemPrivate *this)

{
  QGraphicsLayoutItemPrivate *in_RDI;
  QGraphicsLayoutItem *parent;
  QGraphicsLayoutItem *q;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_18 = q_func(in_RDI);
  while( true ) {
    local_19 = false;
    if (local_18 != (QGraphicsLayoutItem *)0x0) {
      local_19 = QGraphicsLayoutItem::isLayout((QGraphicsLayoutItem *)0x9b482e);
    }
    if (local_19 == false) break;
    local_18 = QGraphicsLayoutItem::parentLayoutItem((QGraphicsLayoutItem *)0x9b4846);
  }
  if (local_18 == (QGraphicsLayoutItem *)0x0) {
    local_28 = (QGraphicsItem *)0x0;
  }
  else {
    local_28 = QGraphicsLayoutItem::graphicsItem((QGraphicsLayoutItem *)0x9b485f);
  }
  return local_28;
}

Assistant:

QGraphicsItem *QGraphicsLayoutItemPrivate::parentItem() const
{
    Q_Q(const QGraphicsLayoutItem);

    const QGraphicsLayoutItem *parent = q;
    while (parent && parent->isLayout()) {
        parent = parent->parentLayoutItem();
    }
    return parent ? parent->graphicsItem() : nullptr;
}